

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isPossiblePropertyPortItem(TokenKind kind)

{
  bool bVar1;
  int iVar2;
  undefined6 in_register_0000003a;
  
  iVar2 = (int)CONCAT62(in_register_0000003a,kind);
  if (iVar2 < 0xc2) {
    if ((iVar2 != 0x12) && (iVar2 != 0x1a)) goto LAB_001a1348;
  }
  else if (((0x3f < iVar2 - 0xc2U) ||
           ((0x8000804000010003U >> ((ulong)(iVar2 - 0xc2U) & 0x3f) & 1) == 0)) && (iVar2 != 0x113))
  {
LAB_001a1348:
    bVar1 = isPossibleDataType(kind);
    return bVar1;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isPossiblePropertyPortItem(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesisStar:
        case TokenKind::LocalKeyword:
        case TokenKind::PropertyKeyword:
        case TokenKind::SequenceKeyword:
        case TokenKind::Comma:
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
        case TokenKind::RefKeyword:
            return true;
        default:
            return isPossibleDataType(kind);
    }
}